

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array2d_kernel.h
# Opt level: O2

void __thiscall
dlib::array2d<dlib::text_grid::data_type,_dlib::memory_manager_stateless_kernel_1<char>_>::clear
          (array2d<dlib::text_grid::data_type,_dlib::memory_manager_stateless_kernel_1<char>_> *this
          )

{
  if (this->data != (data_type *)0x0) {
    memory_manager_stateless_kernel_1<dlib::text_grid::data_type>::deallocate_array
              (&this->pool,this->data);
    this->nr_ = 0;
    this->data = (data_type *)0x0;
    this->nc_ = 0;
    this->at_start_ = true;
    this->cur = (data_type *)0x0;
    this->last = (data_type *)0x0;
  }
  return;
}

Assistant:

void clear (
        )
        {
            if (data != 0)
            {
                pool.deallocate_array(data);
                nc_ = 0;
                nr_ = 0;
                data = 0;
                at_start_ = true;
                cur = 0;
                last = 0;
            }
        }